

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O2

void readannotations(uint32 numannos,uint8 *base,uint8 **ptr,uint32 *len,
                    MOJOSHADER_effectAnnotation **annotations,MOJOSHADER_effectObject *objects,
                    MOJOSHADER_malloc m,void *d)

{
  uint uVar1;
  uint32 *puVar2;
  MOJOSHADER_effectAnnotation *pMVar3;
  uint32 valoffset;
  long lVar4;
  uint32 typeoffset;
  uint32 uVar5;
  
  if (numannos != 0) {
    pMVar3 = (MOJOSHADER_effectAnnotation *)(*m)(numannos << 6,d);
    *annotations = pMVar3;
    memset(pMVar3,0,(ulong)(numannos << 6));
    for (lVar4 = 0; (ulong)numannos << 6 != lVar4; lVar4 = lVar4 + 0x40) {
      pMVar3 = *annotations;
      uVar1 = *len;
      uVar5 = 0;
      if (uVar1 < 4) {
        typeoffset = 0;
LAB_00123bbe:
        valoffset = 0;
      }
      else {
        puVar2 = (uint32 *)*ptr;
        typeoffset = *puVar2;
        *ptr = (uint8 *)(puVar2 + 1);
        *len = uVar1 - 4;
        if (uVar1 - 4 < 4) goto LAB_00123bbe;
        valoffset = puVar2[1];
        *ptr = (uint8 *)(puVar2 + 2);
        uVar5 = uVar1 - 8;
      }
      *len = uVar5;
      readvalue(base,typeoffset,valoffset,(MOJOSHADER_effectValue *)((long)&pMVar3->name + lVar4),
                objects,m,d);
    }
  }
  return;
}

Assistant:

static void readannotations(const uint32 numannos,
                            const uint8 *base,
                            const uint8 **ptr,
                            uint32 *len,
                            MOJOSHADER_effectAnnotation **annotations,
                            MOJOSHADER_effectObject *objects,
                            MOJOSHADER_malloc m,
                            void *d)
{
    int i;
    if (numannos == 0) return;

    const uint32 siz = sizeof(MOJOSHADER_effectAnnotation) * numannos;
    *annotations = (MOJOSHADER_effectAnnotation *) m(siz, d);
    memset(*annotations, '\0', siz);

    for (i = 0; i < numannos; i++)
    {
        MOJOSHADER_effectAnnotation *anno = &(*annotations)[i];

        const uint32 typeoffset = readui32(ptr, len);
        const uint32 valoffset = readui32(ptr, len);

        readvalue(base, typeoffset, valoffset,
                  anno, objects,
                  m, d);
    } // for
}